

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O1

void VP8LClearBackwardRefs(VP8LBackwardRefs *refs)

{
  if (refs->tail_ != (PixOrCopyBlock **)0x0) {
    *refs->tail_ = refs->free_blocks_;
  }
  refs->free_blocks_ = refs->refs_;
  refs->tail_ = &refs->refs_;
  refs->last_block_ = (PixOrCopyBlock *)0x0;
  refs->refs_ = (PixOrCopyBlock *)0x0;
  return;
}

Assistant:

void VP8LClearBackwardRefs(VP8LBackwardRefs* const refs) {
  assert(refs != NULL);
  if (refs->tail_ != NULL) {
    *refs->tail_ = refs->free_blocks_;  // recycle all blocks at once
  }
  refs->free_blocks_ = refs->refs_;
  refs->tail_ = &refs->refs_;
  refs->last_block_ = NULL;
  refs->refs_ = NULL;
}